

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

MutableStringView __thiscall
Corrade::Containers::String::trimmedSuffix(String *this,StringView characters)

{
  char *pcVar1;
  char *end;
  BasicStringView<char> BVar2;
  MutableStringView MVar3;
  BasicStringView<char> local_28;
  
  BasicStringView<char>::BasicStringView(&local_28,this);
  pcVar1 = Implementation::stringFindLastNotAny
                     (local_28._data,local_28._sizePlusFlags & 0x3fffffffffffffff,characters._data,
                      characters._sizePlusFlags & 0x3fffffffffffffff);
  end = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    end = local_28._data;
  }
  if (end == (char *)0x0) {
    BVar2 = (BasicStringView<char>)(ZEXT816(0x8000000000000000) << 0x40);
  }
  else {
    BVar2 = BasicStringView<char>::slice(&local_28,local_28._data,end);
  }
  MVar3._data = BVar2._data;
  MVar3._sizePlusFlags = BVar2._sizePlusFlags;
  return MVar3;
}

Assistant:

MutableStringView String::trimmedSuffix(const StringView characters) {
    return MutableStringView{*this}.trimmedSuffix(characters);
}